

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# real_fourier_ooura.cc
# Opt level: O3

void __thiscall
webrtc::RealFourierOoura::Forward(RealFourierOoura *this,float *src,complex<float> *dest)

{
  complex<float> *pcVar1;
  float *dest_float;
  size_t sVar2;
  
  if (this->length_ == 0) {
    sVar2 = 0;
  }
  else {
    memmove(dest,src,this->length_ << 2);
    sVar2 = this->length_;
  }
  WebRtc_rdft(sVar2,1,(float *)dest,
              (this->work_ip_)._M_t.
              super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
              super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
              super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl,
              (this->work_w_)._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
              super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
              super__Head_base<0UL,_float_*,_false>._M_head_impl);
  sVar2 = this->complex_length_;
  *(undefined4 *)&dest[sVar2 - 1]._M_value = *(undefined4 *)((long)&dest->_M_value + 4);
  *(undefined4 *)((long)&dest[sVar2 - 1]._M_value + 4) = 0;
  *(undefined4 *)((long)&dest->_M_value + 4) = 0;
  if (this->complex_length_ != 0) {
    pcVar1 = dest + this->complex_length_;
    do {
      dest->_M_value = dest->_M_value ^ 0x8000000000000000;
      dest = dest + 1;
    } while (dest != pcVar1);
  }
  return;
}

Assistant:

void RealFourierOoura::Forward(const float* src, complex<float>* dest) const {
  {
    // This cast is well-defined since C++11. See "Non-static data members" at:
    // http://en.cppreference.com/w/cpp/numeric/complex
    auto dest_float = reinterpret_cast<float*>(dest);
    std::copy(src, src + length_, dest_float);
    WebRtc_rdft(length_, 1, dest_float, work_ip_.get(), work_w_.get());
  }

  // Ooura places real[n/2] in imag[0].
  dest[complex_length_ - 1] = complex<float>(dest[0].imag(), 0.0f);
  dest[0] = complex<float>(dest[0].real(), 0.0f);
  // Ooura returns the conjugate of the usual Fourier definition.
  Conjugate(dest, complex_length_);
}